

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O1

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  pointer pcVar1;
  Option *this_00;
  size_t __n;
  pointer pbVar2;
  size_type sVar3;
  App *subcom;
  App *pAVar4;
  pointer ppOVar5;
  pointer ppOVar6;
  size_type sVar7;
  pointer ppOVar8;
  string *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  int iVar11;
  ostream *poVar12;
  App *pAVar13;
  long *plVar14;
  undefined7 in_register_00000009;
  long *plVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  size_type *psVar17;
  pointer pbVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  byte bVar20;
  _Alloc_hider _Var21;
  undefined8 uVar22;
  _Alloc_hider _Var23;
  undefined7 in_register_00000081;
  byte bVar24;
  string name;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string commentLead;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  _Any_data local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  byte local_345;
  uint local_344;
  string local_340;
  string local_320;
  App *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  string *local_2c8;
  ConfigBase *local_2c0;
  string local_2b8;
  long *local_298;
  long local_290;
  long local_288;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  size_type *local_248 [2];
  size_type local_238 [2];
  string local_228;
  string *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  _Any_data local_1f8;
  code *local_1e8;
  undefined8 uStack_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_2f8._4_4_,(int)CONCAT71(in_register_00000081,write_description));
  local_344 = (uint)CONCAT71(in_register_00000009,default_also);
  local_300 = app;
  local_2c8 = prefix;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0._M_string_length = 0;
  local_2f0.field_2._M_local_buf[0] = '\0';
  local_2c0 = this;
  ::std::__cxx11::string::push_back((char)&local_2f0);
  ::std::__cxx11::string::push_back((char)&local_2f0);
  App::get_groups_abi_cxx11_(&local_260,local_300);
  pbVar18 = local_260.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_368._M_unused._M_object = &local_358;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Options","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&local_260,(const_iterator)pbVar18,(value_type *)&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_unused._0_8_ != &local_358) {
    operator_delete(local_368._M_unused._M_object,local_358._M_allocated_capacity + 1);
  }
  if ((byte)local_2f8 != '\0') {
    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
    pcVar1 = (local_300->description_)._M_dataplus._M_p;
    local_368._M_unused._M_object = &local_358;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,pcVar1,pcVar1 + (local_300->description_)._M_string_length);
    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(char *)local_368._M_unused._0_8_,local_368._8_8_);
    local_340._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_340,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_unused._0_8_ != &local_358) {
      operator_delete(local_368._M_unused._M_object,local_358._M_allocated_capacity + 1);
    }
  }
  local_200 = local_260.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_208 = __return_storage_ptr__;
  if (local_260.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_260.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar24 = 0;
    pbVar19 = local_260.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar11 = ::std::__cxx11::string::compare((char *)pbVar19);
      if (((iVar11 != 0) && (bVar20 = bVar24, pbVar19->_M_string_length != 0)) ||
         (bVar20 = 1, (bVar24 & 1) == 0)) {
        if ((((byte)local_2f8 != '\0') &&
            (iVar11 = ::std::__cxx11::string::compare((char *)pbVar19), iVar11 != 0)) &&
           (pbVar19->_M_string_length != 0)) {
          local_368._M_pod_data[0] = 10;
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,local_368._M_pod_data,1);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(pbVar19->_M_dataplus)._M_p,pbVar19->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," Options\n",9);
        }
        local_1f8._M_unused._M_object = (void *)0x0;
        local_1f8._8_8_ = 0;
        local_1e8 = (code *)0x0;
        uStack_1e0 = 0;
        App::get_options(&local_278,local_300,(function<bool_(const_CLI::Option_*)> *)&local_1f8);
        pbVar10 = pbVar19;
        local_345 = bVar20;
        ppOVar5 = local_278.
                  super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppOVar6 = local_278.
                  super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (local_1e8 != (code *)0x0) {
          (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
          ppOVar5 = local_278.
                    super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppOVar6 = local_278.
                    super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        for (; local_2d0 = pbVar10,
            ppOVar8 = local_278.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
            ppOVar5 !=
            local_278.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppOVar5 = ppOVar5 + 1) {
          this_00 = *ppOVar5;
          local_278.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppOVar6;
          if (((this_00->super_OptionBase<CLI::Option>).configurable_ == true) &&
             (((__n = (this_00->super_OptionBase<CLI::Option>).group_._M_string_length,
               __n == pbVar19->_M_string_length &&
               ((__n == 0 ||
                (iVar11 = bcmp((this_00->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p,
                               (pbVar19->_M_dataplus)._M_p,__n), iVar11 == 0)))) ||
              ((iVar11 = ::std::__cxx11::string::compare((char *)pbVar19), iVar11 == 0 &&
               ((this_00->super_OptionBase<CLI::Option>).group_._M_string_length == 0)))))) {
            pbVar18 = (this_00->lnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pbVar18 ==
                (this_00->lnames_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              if ((this_00->pname_)._M_string_length == 0) {
                pbVar2 = (this_00->snames_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pbVar18 = &this_00->envname_;
                if (pbVar2 != (this_00->snames_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                  pbVar18 = pbVar2;
                }
              }
              else {
                pbVar18 = &this_00->pname_;
              }
            }
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_368,local_2c8,pbVar18);
            Option::reduced_results_abi_cxx11_((results_t *)&local_320,this_00);
            detail::ini_join(&local_340,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_320,local_2c0->arraySeparator,local_2c0->arrayStart,
                             local_2c0->arrayEnd);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_320);
            if ((char)local_344 == '\x01' && (char *)local_340._M_string_length == (char *)0x0) {
              pcVar1 = (this_00->default_str_)._M_dataplus._M_p;
              local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_320,pcVar1,
                         pcVar1 + (this_00->default_str_)._M_string_length);
              sVar7 = local_320._M_string_length;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                operator_delete(local_320._M_dataplus._M_p,
                                local_320.field_2._M_allocated_capacity + 1);
              }
              pbVar19 = local_2d0;
              if (sVar7 == 0) {
                if (this_00->expected_min_ == 0) {
                  ::std::__cxx11::string::_M_replace
                            ((ulong)&local_340,0,(char *)local_340._M_string_length,0x16f675);
                }
              }
              else {
                local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
                pcVar1 = (this_00->default_str_)._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2b8,pcVar1,
                           pcVar1 + (this_00->default_str_)._M_string_length);
                detail::convert_arg_for_ini(&local_320,&local_2b8);
                pbVar19 = local_2d0;
                ::std::__cxx11::string::operator=((string *)&local_340,(string *)&local_320);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320._M_dataplus._M_p != &local_320.field_2) {
                  operator_delete(local_320._M_dataplus._M_p,
                                  local_320.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                  operator_delete(local_2b8._M_dataplus._M_p,
                                  local_2b8.field_2._M_allocated_capacity + 1);
                }
              }
            }
            if ((char *)local_340._M_string_length != (char *)0x0) {
              if (((byte)local_2f8 != '\0') && ((this_00->description_)._M_string_length != 0)) {
                local_320._M_dataplus._M_p._0_1_ = 10;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_320,1)
                ;
                poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (local_1a8,local_2f0._M_dataplus._M_p,local_2f0._M_string_length
                                    );
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                pcVar1 = (this_00->description_)._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_228,pcVar1,
                           pcVar1 + (this_00->description_)._M_string_length);
                detail::fix_newlines(&local_320,&local_2f0,&local_228);
                poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,local_320._M_dataplus._M_p,local_320._M_string_length);
                local_2b8._M_dataplus._M_p._0_1_ = 10;
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_2b8,1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320._M_dataplus._M_p != &local_320.field_2) {
                  operator_delete(local_320._M_dataplus._M_p,
                                  local_320.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p,
                                  local_228.field_2._M_allocated_capacity + 1);
                }
              }
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
              local_320._M_dataplus._M_p._0_1_ = local_2c0->valueDelimiter;
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)&local_320,1);
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,local_340._M_dataplus._M_p,local_340._M_string_length);
              local_320._M_dataplus._M_p._0_1_ = 10;
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_320,1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != &local_340.field_2) {
              operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_unused._0_8_ != &local_358) {
              operator_delete(local_368._M_unused._M_object,local_358._M_allocated_capacity + 1);
            }
          }
          pbVar10 = local_2d0;
          ppOVar6 = local_278.
                    super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          local_278.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppOVar8;
        }
        local_278.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppOVar6;
        bVar24 = local_345;
        if (local_278.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.
                          super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_278.
                                super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_278.
                                super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          bVar24 = local_345;
        }
      }
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 != local_200);
  }
  local_358._M_allocated_capacity = 0;
  local_358._8_8_ = 0;
  local_368._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_368._8_8_ = 0;
  App::get_subcommands
            ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)&local_2b8,local_300,
             (function<bool_(const_CLI::App_*)> *)&local_368);
  if ((code *)local_358._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_358._M_allocated_capacity)(&local_368,&local_368,3);
  }
  sVar7 = local_2b8._M_string_length;
  local_344 = local_344 & 0xff;
  local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(local_2d0._4_4_,(uint)(byte)local_2f8);
  if (local_2b8._M_dataplus._M_p != (pointer)local_2b8._M_string_length) {
    _Var21._M_p = local_2b8._M_dataplus._M_p;
    do {
      sVar3 = *(size_type *)_Var21._M_p;
      if (*(long *)(sVar3 + 0x10) == 0) {
        if (((byte)local_2f8 != '\0') && (*(long *)(sVar3 + 0x2d8) != 0)) {
          local_368._M_pod_data[0] = 10;
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,local_368._M_pod_data,1);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,*(char **)(sVar3 + 0x2d0),*(long *)(sVar3 + 0x2d8));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," Options\n",9);
        }
        pcVar1 = (local_2c8->_M_dataplus)._M_p;
        local_1d8[0] = local_1c8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar1,pcVar1 + local_2c8->_M_string_length);
        (**(local_2c0->super_Config)._vptr_Config)
                  (&local_368,local_2c0,sVar3,(ulong)local_344,(ulong)local_2d0 & 0xffffffff,
                   (string *)local_1d8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_unused._0_8_ != &local_358) {
          operator_delete(local_368._M_unused._M_object,(ulong)(local_358._M_allocated_capacity + 1)
                         );
        }
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
      }
      _Var21._M_p = _Var21._M_p + 8;
    } while (_Var21._M_p != (pointer)sVar7);
  }
  local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_string_length;
  if (local_2b8._M_dataplus._M_p != (pointer)local_2b8._M_string_length) {
    _Var21._M_p = local_2b8._M_dataplus._M_p;
    do {
      subcom = *(App **)_Var21._M_p;
      if ((subcom->name_)._M_string_length != 0) {
        if ((subcom->configurable_ == true) &&
           (pAVar13 = App::get_subcommand(local_300,subcom), pAVar13->parsed_ != 0)) {
          if ((local_2c8->_M_string_length == 0) && (local_300->parent_ != (App *)0x0)) {
            local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
            pcVar1 = (local_300->name_)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_340,pcVar1,pcVar1 + (local_300->name_)._M_string_length);
            ::std::__cxx11::string::append((char *)&local_340);
            plVar14 = (long *)::std::__cxx11::string::_M_append
                                        ((char *)&local_340,(ulong)(subcom->name_)._M_dataplus._M_p)
            ;
            local_368._M_unused._M_object = &local_358;
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 == paVar16) {
              local_358._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_358._8_8_ = plVar14[3];
            }
            else {
              local_358._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_368._M_unused._M_object =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar14;
            }
            local_368._8_8_ = plVar14[1];
            *plVar14 = (long)paVar16;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != &local_340.field_2) {
              operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1
                             );
            }
            pAVar13 = local_300->parent_;
            pAVar4 = pAVar13->parent_;
            while (pAVar4 != (App *)0x0) {
              local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
              pcVar1 = (pAVar13->name_)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_320,pcVar1,pcVar1 + (pAVar13->name_)._M_string_length);
              ::std::__cxx11::string::append((char *)&local_320);
              plVar14 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_320,local_368._M_unused._M_member_pointer)
              ;
              psVar17 = (size_type *)(plVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar17) {
                local_340.field_2._M_allocated_capacity = *psVar17;
                local_340.field_2._8_8_ = plVar14[3];
                local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
              }
              else {
                local_340.field_2._M_allocated_capacity = *psVar17;
                local_340._M_dataplus._M_p = (pointer)*plVar14;
              }
              local_340._M_string_length = plVar14[1];
              *plVar14 = (long)psVar17;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              ::std::__cxx11::string::operator=
                        ((string *)local_368._M_pod_data,(string *)&local_340);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_340._M_dataplus._M_p != &local_340.field_2) {
                operator_delete(local_340._M_dataplus._M_p,
                                local_340.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                operator_delete(local_320._M_dataplus._M_p,
                                local_320.field_2._M_allocated_capacity + 1);
              }
              pAVar13 = pAVar13->parent_;
              pAVar4 = pAVar13->parent_;
            }
            local_340._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_340._M_dataplus._M_p >> 8);
            local_340._M_dataplus._M_p._0_1_ = 0x5b;
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_340,1);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)local_368._M_unused._0_8_,local_368._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_unused._0_8_ != &local_358) {
              operator_delete(local_368._M_unused._M_object,
                              (ulong)(local_358._M_allocated_capacity + 1));
            }
          }
          else {
            local_368._M_pod_data[0] = 0x5b;
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,local_368._M_pod_data,1);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(local_2c8->_M_dataplus)._M_p,local_2c8->_M_string_length);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(subcom->name_)._M_dataplus._M_p,
                                 (subcom->name_)._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]\n",2);
          }
          local_248[0] = local_238;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"");
          (**(local_2c0->super_Config)._vptr_Config)
                    (&local_368,local_2c0,subcom,(ulong)local_344,(ulong)local_2d0 & 0xffffffff,
                     (string *)local_248);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_unused._0_8_ != &local_358) {
            operator_delete(local_368._M_unused._M_object,
                            (ulong)(local_358._M_allocated_capacity + 1));
          }
          uVar22 = local_238[0];
          _Var23._M_p = (pointer)local_248[0];
          if (local_248[0] != local_238) {
LAB_00114a0d:
            operator_delete(_Var23._M_p,uVar22 + 1);
          }
        }
        else {
          ::std::operator+(&local_340,local_2c8,&subcom->name_);
          plVar14 = (long *)::std::__cxx11::string::append((char *)&local_340);
          plVar15 = plVar14 + 2;
          if ((long *)*plVar14 == plVar15) {
            local_288 = *plVar15;
            uStack_280 = (undefined4)plVar14[3];
            uStack_27c = *(undefined4 *)((long)plVar14 + 0x1c);
            local_298 = &local_288;
          }
          else {
            local_288 = *plVar15;
            local_298 = (long *)*plVar14;
          }
          local_290 = plVar14[1];
          *plVar14 = (long)plVar15;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          (**(local_2c0->super_Config)._vptr_Config)
                    (&local_368,local_2c0,subcom,(ulong)local_344,(ulong)local_2d0 & 0xffffffff,
                     &local_298);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,(char *)local_368._M_unused._0_8_,local_368._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_unused._0_8_ != &local_358) {
            operator_delete(local_368._M_unused._M_object,
                            (ulong)(local_358._M_allocated_capacity + 1));
          }
          if (local_298 != &local_288) {
            operator_delete(local_298,local_288 + 1);
          }
          uVar22 = local_340.field_2._M_allocated_capacity;
          _Var23._M_p = local_340._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) goto LAB_00114a0d;
        }
      }
      _Var21._M_p = _Var21._M_p + 8;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var21._M_p != local_2f8);
  }
  psVar9 = local_208;
  ::std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    local_2b8.field_2._M_allocated_capacity - (long)local_2b8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,
                    CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                             local_2f0.field_2._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar9;
}

Assistant:

inline std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("Options"));
    if(write_description) {
        out << commentLead << app->get_description() << '\n';
    }
    for(auto &group : groups) {
        if(group == "Options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "Options" && !group.empty()) {
            out << '\n' << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {

            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "Options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string name = prefix + opt->get_single_name();
                std::string value = detail::ini_join(opt->reduced_results(), arraySeparator, arrayStart, arrayEnd);

                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str());
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    }
                }

                if(!value.empty()) {
                    if(write_description && opt->has_description()) {
                        out << '\n';
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }
    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(subcom->get_configurable() && app->got_subcommand(subcom)) {
                if(!prefix.empty() || app->get_parent() == nullptr) {
                    out << '[' << prefix << subcom->get_name() << "]\n";
                } else {
                    std::string subname = app->get_name() + "." + subcom->get_name();
                    auto p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        subname = p->get_name() + "." + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subcom->get_name() + ".");
            }
        }
    }

    return out.str();
}